

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O1

void Saig_ManWindowCreatePos(Aig_Man_t *pNew,Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  Aig_Obj_t *pAVar10;
  long lVar11;
  
  pVVar3 = p0->vObjs;
  if (0 < pVVar3->nSize) {
    lVar11 = 0;
    do {
      pAVar4 = (Aig_Obj_t *)pVVar3->pArray[lVar11];
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = p0->nTravIds, pAVar4->TravId != iVar1)) {
        if (((ulong)pAVar4 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
        }
        uVar6 = (uint)*(undefined8 *)&pAVar4->field_0x18;
        uVar8 = uVar6 & 7;
        if (1 < (ulong)uVar8 - 1) {
          if (p0->pReprs == (Aig_Obj_t **)0x0) {
            pAVar10 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar10 = p0->pReprs[pAVar4->Id];
          }
          if (p1->pReprs == (Aig_Obj_t **)0x0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = p1->pReprs[pAVar10->Id];
          }
          if (pAVar4 != pAVar5) {
            __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                          ,0x298,
                          "void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
          }
          if (uVar8 == 3) {
            uVar7 = (ulong)pAVar4->pFanin0 & 0xfffffffffffffffe;
            uVar9 = (ulong)pAVar10->pFanin0 & 0xfffffffffffffffe;
            if ((*(int *)(uVar9 + 0x20) != p1->nTravIds) == (*(int *)(uVar7 + 0x20) == iVar1)) {
              __assert_fail("Aig_ObjIsTravIdCurrent(p0, pFanin0) == Aig_ObjIsTravIdCurrent(p1, pFanin1)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                            ,0x29e,
                            "void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
            }
            if (*(int *)(uVar7 + 0x20) == iVar1) {
LAB_006fa039:
              pAVar4 = Aig_Exor(pNew,*(Aig_Obj_t **)(uVar7 + 0x28),*(Aig_Obj_t **)(uVar9 + 0x28));
              Aig_ObjCreateCo(pNew,pAVar4);
            }
          }
          else {
            if ((uVar6 & 7) - 7 < 0xfffffffe) {
              __assert_fail("Aig_ObjIsNode(pObj0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                            ,0x2a7,
                            "void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
            }
            uVar7 = (ulong)pAVar4->pFanin0 & 0xfffffffffffffffe;
            uVar9 = (ulong)pAVar10->pFanin0 & 0xfffffffffffffffe;
            iVar2 = *(int *)(uVar7 + 0x20);
            if ((*(int *)(uVar9 + 0x20) != p1->nTravIds) == (iVar2 == iVar1)) {
              __assert_fail("Aig_ObjIsTravIdCurrent(p0, pFanin0) == Aig_ObjIsTravIdCurrent(p1, pFanin1)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                            ,0x2ac,
                            "void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
            }
            if (iVar2 == iVar1) {
              pAVar5 = Aig_Exor(pNew,*(Aig_Obj_t **)(uVar7 + 0x28),*(Aig_Obj_t **)(uVar9 + 0x28));
              Aig_ObjCreateCo(pNew,pAVar5);
            }
            uVar7 = (ulong)pAVar4->pFanin1 & 0xfffffffffffffffe;
            uVar9 = (ulong)pAVar10->pFanin1 & 0xfffffffffffffffe;
            if ((*(int *)(uVar9 + 0x20) != p1->nTravIds) == (*(int *)(uVar7 + 0x20) == p0->nTravIds)
               ) {
              __assert_fail("Aig_ObjIsTravIdCurrent(p0, pFanin0) == Aig_ObjIsTravIdCurrent(p1, pFanin1)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                            ,0x2b6,
                            "void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
            }
            if (*(int *)(uVar7 + 0x20) == p0->nTravIds) goto LAB_006fa039;
          }
        }
      }
      lVar11 = lVar11 + 1;
      pVVar3 = p0->vObjs;
    } while (lVar11 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Saig_ManWindowCreatePos( Aig_Man_t * pNew, Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1, * pMiter;
    Aig_Obj_t * pFanin0, * pFanin1;
    int i;
    Aig_ManForEachObj( p0, pObj0, i )
    {
        if ( Aig_ObjIsTravIdCurrent(p0, pObj0) )
            continue;
        if ( Aig_ObjIsConst1(pObj0) )
            continue;
        if ( Aig_ObjIsCi(pObj0) )
            continue;
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );
        if ( Aig_ObjIsCo(pObj0) )
        {
            pFanin0 = Aig_ObjFanin0(pObj0);
            pFanin1 = Aig_ObjFanin0(pObj1);
            assert( Aig_ObjIsTravIdCurrent(p0, pFanin0) ==
                    Aig_ObjIsTravIdCurrent(p1, pFanin1) );
            if ( Aig_ObjIsTravIdCurrent(p0, pFanin0) )
            {
                pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pFanin0->pData, (Aig_Obj_t *)pFanin1->pData );
                Aig_ObjCreateCo( pNew, pMiter );
            }
        }
        else
        {
            assert( Aig_ObjIsNode(pObj0) );

            pFanin0 = Aig_ObjFanin0(pObj0);
            pFanin1 = Aig_ObjFanin0(pObj1);
            assert( Aig_ObjIsTravIdCurrent(p0, pFanin0) ==
                    Aig_ObjIsTravIdCurrent(p1, pFanin1) );
            if ( Aig_ObjIsTravIdCurrent(p0, pFanin0) )
            {
                pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pFanin0->pData, (Aig_Obj_t *)pFanin1->pData );
                Aig_ObjCreateCo( pNew, pMiter );
            }

            pFanin0 = Aig_ObjFanin1(pObj0);
            pFanin1 = Aig_ObjFanin1(pObj1);
            assert( Aig_ObjIsTravIdCurrent(p0, pFanin0) ==
                    Aig_ObjIsTravIdCurrent(p1, pFanin1) );
            if ( Aig_ObjIsTravIdCurrent(p0, pFanin0) )
            {
                pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pFanin0->pData, (Aig_Obj_t *)pFanin1->pData );
                Aig_ObjCreateCo( pNew, pMiter );
            }
        }
    }
}